

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibrary.cpp
# Opt level: O0

bool __thiscall
Jinx::Impl::Library::RegisterPropertyName
          (Library *this,PropertyName *propertyName,bool checkForDuplicates)

{
  bool bVar1;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  bool checkForDuplicates_local;
  PropertyName *propertyName_local;
  Library *this_local;
  
  lock._M_device._7_1_ = checkForDuplicates;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->m_propertyMutex);
  bVar1 = RegisterPropertyNameInternal(this,propertyName,(bool)(lock._M_device._7_1_ & 1));
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return bVar1;
}

Assistant:

inline_t bool Library::RegisterPropertyName(const PropertyName & propertyName, bool checkForDuplicates)
	{
		std::lock_guard<std::mutex> lock(m_propertyMutex);
		return RegisterPropertyNameInternal(propertyName, checkForDuplicates);
	}